

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O1

Var Js::SharedArrayBuffer::EntrySlice(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  RuntimeFunction *defaultConstructor;
  ThreadContext *this;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  Attributes attributes;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined4 *puVar11;
  Var pvVar12;
  SharedArrayBuffer *object;
  int64 iVar13;
  RecyclableObject *pRVar14;
  ulong length;
  RuntimeFunction *instanceObj;
  SharedArrayBuffer *pSVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar16;
  int in_stack_00000010;
  anon_class_24_3_84176547_for_newObjectCreationFunction local_98;
  anon_class_24_3_84176547_for_newObjectCreationFunction local_78;
  undefined1 local_60 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x80,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00d5b5fe;
    *puVar11 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_60 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_60,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x83,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar5) goto LAB_00d5b5fe;
    *puVar11 = 0;
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x85,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00d5b5fe;
    *puVar11 = 0;
  }
  pvVar12 = Arguments::operator[]((Arguments *)local_60,0);
  bVar5 = VarIs<Js::SharedArrayBuffer>(pvVar12);
  if (!bVar5) goto LAB_00d5b609;
  pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  iVar13 = 0;
  pvVar12 = Arguments::operator[]((Arguments *)local_60,0);
  object = VarTo<Js::SharedArrayBuffer>(pvVar12);
  uVar7 = (*(object->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    ();
  length = (ulong)uVar7;
  uVar16 = length;
  if (((ulong)local_60 & 0xfffffe) != 0) {
    pvVar12 = Arguments::operator[]((Arguments *)local_60,1);
    iVar13 = JavascriptArray::GetIndexFromVar(pvVar12,length,pSVar2);
    if ((2 < (local_60._0_4_ & 0xffffff)) &&
       (pRVar14 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_60,2),
       pRVar14 != (pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr)) {
      pvVar12 = Arguments::operator[]((Arguments *)local_60,2);
      length = JavascriptArray::GetIndexFromVar(pvVar12,length,pSVar2);
    }
    uVar16 = length - iVar13;
    if (length - iVar13 == 0 || (long)length < iVar13) {
      uVar16 = 0;
    }
  }
  if (0x7ffffffe < (long)uVar16) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0xac,"(newLen < MaxSharedArrayBufferLength)",
                                "newLen < MaxSharedArrayBufferLength");
    if (!bVar5) goto LAB_00d5b5fe;
    *puVar11 = 0;
  }
  defaultConstructor =
       (((pSVar2->super_ScriptContextBase).javascriptLibrary)->sharedArrayBufferConstructor).ptr;
  instanceObj = (RuntimeFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)object,&defaultConstructor->super_JavascriptFunction,
                           pSVar2);
  bVar5 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0xb3,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar5) goto LAB_00d5b5fe;
    *puVar11 = 0;
  }
  this = pSVar2->threadContext;
  uVar7 = (uint)uVar16;
  local_78.constructor = (RecyclableObject *)instanceObj;
  local_78.newbyteLength = uVar7;
  local_78.scriptContext = pSVar2;
  if (instanceObj == defaultConstructor) {
    bVar5 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    pRVar14 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_84176547_for_newObjectCreationFunction::operator()(&local_78);
    this->reentrancySafeOrHandled = bVar5;
  }
  else {
    local_98._12_4_ = local_78._12_4_;
    bVar5 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    local_98.constructor = (RecyclableObject *)instanceObj;
    local_98.newbyteLength = uVar7;
    local_98.scriptContext = pSVar2;
    attributes = FunctionInfo::GetAttributes((RecyclableObject *)instanceObj);
    bVar6 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)instanceObj,attributes);
    if (bVar6) {
      pRVar14 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_84176547_for_newObjectCreationFunction::operator()(&local_98);
      bVar6 = ThreadContext::IsOnStack(pRVar14);
LAB_00d5b3f2:
      if (bVar6 != false) {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      }
    }
    else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      if ((attributes & HasNoSideEffect) != None) {
        pRVar14 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_84176547_for_newObjectCreationFunction::operator()(&local_98);
        bVar6 = ThreadContext::IsOnStack(pRVar14);
        goto LAB_00d5b3f2;
      }
      IVar1 = this->implicitCallFlags;
      pRVar14 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_84176547_for_newObjectCreationFunction::operator()(&local_98);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    }
    else {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar14 = (((((((((instanceObj->super_JavascriptFunction).super_DynamicObject.
                        super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                    super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                 javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    this->reentrancySafeOrHandled = bVar5;
  }
  bVar5 = VarIs<Js::SharedArrayBuffer>(pRVar14);
  if ((!bVar5) || (pSVar15 = VarTo<Js::SharedArrayBuffer>(pRVar14), pSVar15 == object)) {
LAB_00d5b609:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5e9e3,(PCWSTR)0x0);
  }
  uVar8 = (*(pSVar15->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    (pSVar15);
  if (uVar8 < uVar7) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ebf6,L"SharedArrayBuffer.prototype.slice");
  }
  uVar8 = (*(pSVar15->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    (pSVar15);
  if (uVar8 < uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0xcf,"(newBuffer->GetByteLength() >= newbyteLength)",
                                "newBuffer->GetByteLength() >= newbyteLength");
    if (!bVar5) goto LAB_00d5b5fe;
    *puVar11 = 0;
  }
  if (uVar7 != 0) {
    iVar9 = (*(object->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(object);
    if (CONCAT44(extraout_var,iVar9) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                  ,0xd4,"(currentBuffer->GetBuffer() != nullptr)",
                                  "buffer must not be null when we copy from it");
      if (!bVar5) {
LAB_00d5b5fe:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar11 = 0;
    }
    iVar9 = (*(pSVar15->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pSVar15);
    iVar10 = (*(object->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
               [0x72])(object);
    js_memcpy_s((void *)CONCAT44(extraout_var_00,iVar9),uVar16 & 0xffffffff,
                (void *)(iVar13 + CONCAT44(extraout_var_01,iVar10)),uVar16 & 0xffffffff);
  }
  return pSVar15;
}

Assistant:

Var SharedArrayBuffer::EntrySlice(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Assert(!(callInfo.Flags & CallFlags_New));

        if (!VarIs<SharedArrayBuffer>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedSharedArrayBufferObject);
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        SharedArrayBuffer* currentBuffer = VarTo<SharedArrayBuffer>(args[0]);

        int64 currentLen = (int64)currentBuffer->GetByteLength();
        int64 start = 0, end = 0;
        int64 newLen = 0;

        // If no start or end arguments, use the entire length
        if (args.Info.Count < 2)
        {
            newLen = currentLen;
        }
        else
        {
            start = JavascriptArray::GetIndexFromVar(args[1], currentLen, scriptContext);

            // If no end argument, use length as the end
            if (args.Info.Count < 3 || args[2] == library->GetUndefined())
            {
                end = currentLen;
            }
            else
            {
                end = JavascriptArray::GetIndexFromVar(args[2], currentLen, scriptContext);
            }

            newLen = end > start ? end - start : 0;
        }

        // We can't have allocated an SharedArrayBuffer with byteLength > MaxArrayBufferLength.
        // start and end are clamped to valid indices, so the new length also cannot exceed MaxArrayBufferLength.
        // Therefore, should be safe to cast down newLen to uint32.
        Assert(newLen < MaxSharedArrayBufferLength);
        uint32 newbyteLength = static_cast<uint32>(newLen);

        SharedArrayBuffer* newBuffer = nullptr;

        JavascriptFunction* defaultConstructor = scriptContext->GetLibrary()->GetSharedArrayBufferConstructor();
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(currentBuffer, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        Js::Var newVar = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
        {
            Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(newbyteLength, scriptContext) };
            Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
            return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext);
        });

        if (!VarIs<SharedArrayBuffer>(newVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedSharedArrayBufferObject);
        }

        newBuffer = VarTo<SharedArrayBuffer>(newVar);

        if (newBuffer == currentBuffer)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedSharedArrayBufferObject);
        }

        if (newBuffer->GetByteLength() < newbyteLength)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ArgumentOutOfRange, _u("SharedArrayBuffer.prototype.slice"));
        }

        Assert(newBuffer);
        Assert(newBuffer->GetByteLength() >= newbyteLength);

        // Don't bother doing memcpy if we aren't copying any elements
        if (newbyteLength > 0)
        {
            AssertMsg(currentBuffer->GetBuffer() != nullptr, "buffer must not be null when we copy from it");

            js_memcpy_s(newBuffer->GetBuffer(), newbyteLength, currentBuffer->GetBuffer() + start, newbyteLength);
        }

        return newBuffer;
    }